

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_to_local_pass.cpp
# Opt level: O2

uint32_t __thiscall
spvtools::opt::PrivateToLocalPass::GetNewType(PrivateToLocalPass *this,uint32_t old_type_id)

{
  IRContext *this_00;
  uint32_t uVar1;
  TypeManager *this_01;
  DefUseManager *pDVar2;
  Instruction *pIVar3;
  
  this_01 = IRContext::get_type_mgr((this->super_Pass).context_);
  pDVar2 = Pass::get_def_use_mgr(&this->super_Pass);
  pIVar3 = analysis::DefUseManager::GetDef(pDVar2,old_type_id);
  uVar1 = Instruction::GetSingleWordInOperand(pIVar3,1);
  uVar1 = analysis::TypeManager::FindPointerToType(this_01,uVar1,Function);
  if (uVar1 != 0) {
    this_00 = (this->super_Pass).context_;
    pDVar2 = IRContext::get_def_use_mgr(this_00);
    pIVar3 = analysis::DefUseManager::GetDef(pDVar2,uVar1);
    IRContext::UpdateDefUse(this_00,pIVar3);
  }
  return uVar1;
}

Assistant:

uint32_t PrivateToLocalPass::GetNewType(uint32_t old_type_id) {
  auto type_mgr = context()->get_type_mgr();
  Instruction* old_type_inst = get_def_use_mgr()->GetDef(old_type_id);
  uint32_t pointee_type_id =
      old_type_inst->GetSingleWordInOperand(kSpvTypePointerTypeIdInIdx);
  uint32_t new_type_id =
      type_mgr->FindPointerToType(pointee_type_id, spv::StorageClass::Function);
  if (new_type_id != 0) {
    context()->UpdateDefUse(context()->get_def_use_mgr()->GetDef(new_type_id));
  }
  return new_type_id;
}